

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NodeCollapseSuppSize(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins)

{
  size_t sVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  int iVar4;
  void **ppvVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  
  vFanins->nSize = 0;
  iVar4 = (pFanout->vFanins).nSize;
  if (iVar4 < 1) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    lVar7 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pFanout->pNtk->vObjs->pArray[(pFanout->vFanins).pArray[lVar7]];
      if (pAVar2 != pFanin) {
        if (0 < (int)uVar8) {
          uVar6 = 0;
          do {
            if ((Abc_Obj_t *)vFanins->pArray[uVar6] == pAVar2) goto LAB_001dd738;
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
        if (uVar8 == vFanins->nCap) {
          if ((int)uVar8 < 0x10) {
            if (vFanins->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
            }
            vFanins->pArray = ppvVar5;
            vFanins->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)(uVar8 * 2) * 8;
            if (vFanins->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(sVar1);
            }
            else {
              ppvVar5 = (void **)realloc(vFanins->pArray,sVar1);
            }
            vFanins->pArray = ppvVar5;
            vFanins->nCap = uVar8 * 2;
          }
        }
        else {
          ppvVar5 = vFanins->pArray;
        }
        iVar4 = vFanins->nSize;
        uVar8 = iVar4 + 1;
        vFanins->nSize = uVar8;
        ppvVar5[iVar4] = pAVar2;
        iVar4 = (pFanout->vFanins).nSize;
      }
LAB_001dd738:
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  iVar4 = (pFanin->vFanins).nSize;
  if (0 < iVar4) {
    lVar7 = 0;
    do {
      pvVar3 = pFanin->pNtk->vObjs->pArray[(pFanin->vFanins).pArray[lVar7]];
      if (0 < (int)uVar8) {
        uVar6 = 0;
        do {
          if (vFanins->pArray[uVar6] == pvVar3) goto LAB_001dd80c;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
      if (uVar8 == vFanins->nCap) {
        if ((int)uVar8 < 0x10) {
          if (vFanins->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
          }
          vFanins->pArray = ppvVar5;
          vFanins->nCap = 0x10;
        }
        else {
          sVar1 = (ulong)(uVar8 * 2) * 8;
          if (vFanins->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(sVar1);
          }
          else {
            ppvVar5 = (void **)realloc(vFanins->pArray,sVar1);
          }
          vFanins->pArray = ppvVar5;
          vFanins->nCap = uVar8 * 2;
        }
      }
      else {
        ppvVar5 = vFanins->pArray;
      }
      iVar4 = vFanins->nSize;
      uVar8 = iVar4 + 1;
      vFanins->nSize = uVar8;
      ppvVar5[iVar4] = pvVar3;
      iVar4 = (pFanin->vFanins).nSize;
LAB_001dd80c:
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  return uVar8;
}

Assistant:

int Abc_NodeCollapseSuppSize( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_PtrClear( vFanins );
    Abc_ObjForEachFanin( pFanout, pObj, i )
        if ( pObj != pFanin )
            Vec_PtrPushUnique( vFanins, pObj );
    Abc_ObjForEachFanin( pFanin, pObj, i )
        Vec_PtrPushUnique( vFanins, pObj );
    return Vec_PtrSize( vFanins );
}